

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

CaseAssertionExpr * __thiscall
slang::BumpAllocator::
emplace<slang::ast::CaseAssertionExpr,slang::ast::Expression_const&,std::span<slang::ast::CaseAssertionExpr::ItemGroup,18446744073709551615ul>,slang::ast::AssertionExpr_const*&>
          (BumpAllocator *this,Expression *args,
          span<slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL> *args_1,
          AssertionExpr **args_2)

{
  AssertionExpr *pAVar1;
  pointer pIVar2;
  size_t sVar3;
  CaseAssertionExpr *pCVar4;
  
  pCVar4 = (CaseAssertionExpr *)allocate(this,0x30,8);
  pIVar2 = args_1->_M_ptr;
  sVar3 = (args_1->_M_extent)._M_extent_value;
  pAVar1 = *args_2;
  (pCVar4->super_AssertionExpr).kind = Case;
  (pCVar4->super_AssertionExpr).syntax = (SyntaxNode *)0x0;
  pCVar4->expr = args;
  (pCVar4->items)._M_ptr = pIVar2;
  (pCVar4->items)._M_extent._M_extent_value = sVar3;
  pCVar4->defaultCase = pAVar1;
  return pCVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }